

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

void __thiscall Pathie::Path::sanitize(Path *this)

{
  size_type sVar1;
  ulong uVar2;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  uVar2 = std::__cxx11::string::find((char *)this,0x10f118,0);
  while (uVar2 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)this,uVar2,(char *)0x1,0x10f1b8);
    uVar2 = std::__cxx11::string::find((char *)this,0x10f118,0);
  }
  uVar2 = std::__cxx11::string::find((char *)this,0x10f11a,0);
  while (uVar2 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)this,uVar2,(char *)0x2,0x10f1b8);
    uVar2 = std::__cxx11::string::find((char *)this,0x10f11a,0);
  }
  sVar1 = (this->m_path)._M_string_length;
  if ((1 < (long)sVar1) && ((this->m_path)._M_dataplus._M_p[sVar1 - 1] == '/')) {
    std::__cxx11::string::substr((ulong)local_38,(ulong)this);
    std::__cxx11::string::_M_assign((string *)this);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0]);
    }
  }
  return;
}

Assistant:

void Path::sanitize()
{
  // Replace any backslashes \ with forward slashes /.
  size_t cur = string::npos;
  while ((cur = m_path.find("\\")) != string::npos) { // assignment intended
    m_path.replace(cur, 1, "/");
  }

  // Replace all double slashes // with a single one
  cur = string::npos;
  while ((cur = m_path.find("//")) != string::npos) { // assignment intended
    m_path.replace(cur, 2, "/");
  }

  // Remove trailing slash if any (except for the filesystem root)
  long len = m_path.length();
#if defined(_PATHIE_UNIX)
  if (len > 1 && m_path[len - 1] == '/')
    m_path = m_path.substr(0, len - 1);
#elif defined(_WIN32)
  if (len > 1) { // / is root of current drive, "x" is the relative path "./x"
    // Check if X:/foo/bar
    if (len > 3 && m_path[len - 1] == '/') { // More than 3 chars cannot be root
      m_path = m_path.substr(0, len - 1);
    }
    else { // Only drive root?
      if (m_path[1] == ':') {
        // Here m_path must be a drive root. The colon ":" is not allowed in paths on Windows except as the 2nd char to denote the drive letter
        if (len == 2) { // Whoa -- "X:" misses leading / for drive root, append it
          m_path.append("/");
        }
        else if (len == 3 && m_path[2] != '/') { // Whoa -- "X:f" misses leading / for root directory, insert it
          m_path.insert(2, "/");
        }
        // else length is 3 with a slash, i.e. "X:/". This is fine and shall not be touched.
      }
      else { // not a drive root, delete trailing / if any
        if (m_path[len - 1] == '/') {
          m_path = m_path.substr(0, len - 1);
        }
      }
    }
  }
#else
#error Unsupported system
#endif
}